

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::metrics::MetricsTest_testTimer_Test::~MetricsTest_testTimer_Test
          (MetricsTest_testTimer_Test *this)

{
  MetricsTest_testTimer_Test *this_local;
  
  ~MetricsTest_testTimer_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(MetricsTest, testTimer)
{
    constexpr auto timeValue = static_cast<int64_t>(5);
    constexpr auto metricName = "jaeger.test-timer";
    StatsFactoryImpl factory(_metricsReporter);
    auto timer = factory.createTimer(metricName);
    timer->record(timeValue);
    const auto& timers = _metricsReporter.timers();
    ASSERT_EQ(1, timers.size());
    auto itr = timers.find(metricName);
    ASSERT_TRUE(itr != std::end(timers));
    ASSERT_EQ(timeValue, itr->second);
}